

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O2

boolean destroy_item(int osym,int dmgtyp)

{
  short sVar1;
  obj *poVar2;
  boolean bVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  int x;
  long lVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  obj *obj;
  bool bVar12;
  bool bVar13;
  uint local_58;
  int local_48;
  
  if (dmgtyp == 2) {
    if (u.uprops[1].intrinsic != 0 || u.uprops[1].extrinsic != 0) {
      if ((u.uprops[1].intrinsic >> 0x1a & 1) == 0) {
        return '\0';
      }
      if ((u.uprops[1].intrinsic & 0xfbffffff) != 0 || u.uprops[1].extrinsic != 0) {
        return '\0';
      }
    }
    uVar4 = youmonst.mintrinsics & 1;
  }
  else if (dmgtyp == 6) {
    if (u.uprops[5].intrinsic != 0 || u.uprops[5].extrinsic != 0) {
      if ((u.uprops[5].intrinsic >> 0x1a & 1) == 0) {
        return '\0';
      }
      if ((u.uprops[5].intrinsic & 0xfbffffff) != 0 || u.uprops[5].extrinsic != 0) {
        return '\0';
      }
    }
    uVar4 = youmonst.mintrinsics & 0x10;
  }
  else {
    if (dmgtyp != 3) goto LAB_002837c4;
    if (u.uprops[2].intrinsic != 0 || u.uprops[2].extrinsic != 0) {
      if ((u.uprops[2].intrinsic >> 0x1a & 1) == 0) {
        return '\0';
      }
      if ((u.uprops[2].intrinsic & 0xfbffffff) != 0 || u.uprops[2].extrinsic != 0) {
        return '\0';
      }
    }
    uVar4 = youmonst.mintrinsics & 2;
  }
  if (uVar4 != 0) {
    return '\0';
  }
LAB_002837c4:
  if (uarmc == (obj *)0x0) {
    bVar13 = true;
    x = 3;
  }
  else {
    bVar13 = uarmc->otyp != 0x84;
    x = 0xf;
    if (bVar13) {
      x = 3;
    }
  }
  bVar3 = '\0';
  poVar2 = invent;
LAB_00283825:
  do {
    obj = poVar2;
    if (obj == (obj *)0x0) {
      return bVar3;
    }
    poVar2 = obj->nobj;
  } while ((((obj->oclass != osym) || (obj->oartifact != '\0')) ||
           (((obj->field_0x4c & 0x80) != 0 && (obj->quan == 1)))) ||
          ((!bVar13 && (uVar5 = mt_random(), uVar5 % 5 != 0))));
  if (dmgtyp == 2) {
    if (((u.uprops[1].intrinsic == 0 && u.uprops[1].extrinsic == 0) ||
        (((u.uprops[1].intrinsic >> 0x1a & 1) != 0 &&
         ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)))) &&
       ((youmonst.mintrinsics & 1) == 0)) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ushort)(obj->oclass != '\b');
    }
    sVar1 = obj->otyp;
    if (sVar1 == 0x1bd) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002839e8;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002839e0;
LAB_00283a18:
        pcVar10 = xname(obj);
        pcVar10 = The(pcVar10);
        pcVar7 = hcolor("dark red");
        pline("%s glows a strange %s, but remains intact.",pcVar10,pcVar7);
        bVar12 = true;
      }
      else {
LAB_002839e0:
        bVar12 = true;
        if (ublindf != (obj *)0x0) {
LAB_002839e8:
          bVar12 = true;
          if (ublindf->oartifact == '\x1d') goto LAB_00283a18;
        }
      }
    }
    else {
      bVar12 = sVar1 == 0x162 || sVar1 == 0x17f;
    }
    iVar6 = obj->quan;
    if (osym == 10) {
      local_48 = 3;
      local_58 = 1;
      goto LAB_00283a8f;
    }
    local_48 = 2;
    local_58 = 1;
    if (osym == 9) goto LAB_00283a8f;
    if (osym != 8) goto LAB_00283825;
    local_58 = rnd(6);
    local_48 = 1;
LAB_00283a8f:
    if (bVar12) goto LAB_00283825;
    if (((((u.uprops[1].intrinsic >> 0x1a & 1) != 0) &&
         ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)) &&
        ((youmonst.mintrinsics & 1) == 0)) && (obj->oclass != '\b')) {
      local_58 = local_58 + 1 >> 1;
    }
  }
  else {
    if (dmgtyp == 6) {
      if ((u.uprops[5].intrinsic == 0 && u.uprops[5].extrinsic == 0) ||
         ((uVar4 = 1, (u.uprops[5].intrinsic >> 0x1a & 1) != 0 &&
          ((u.uprops[5].intrinsic & 0xfbffffff) == 0 && u.uprops[5].extrinsic == 0)))) {
        uVar4 = youmonst.mintrinsics >> 4 & 1;
      }
      if ((osym == 0xb) && (obj->otyp != 0x1d5)) {
        iVar6 = obj->quan;
        local_58 = rnd(10);
        if (((u.uprops[5].intrinsic >> 0x1a & 1) != 0) &&
           (((u.uprops[5].intrinsic & 0xfbffffff) == 0 && u.uprops[5].extrinsic == 0 &&
            ((youmonst.mintrinsics & 0x10) == 0)))) {
          local_58 = local_58 + 1 >> 1;
        }
        local_48 = 4;
        goto LAB_00283adb;
      }
      goto LAB_00283825;
    }
    if (((dmgtyp != 3) || (osym != 8)) || (obj->otyp == 0x142)) goto LAB_00283825;
    iVar6 = obj->quan;
    local_58 = rnd(4);
    uVar4 = 0;
    local_48 = 0;
  }
LAB_00283adb:
  lVar11 = (long)((*(int *)&obj->field_0x4a << 8) >> 0x1f) + (long)iVar6;
  lVar9 = 0;
  if (0 < lVar11) {
    lVar9 = lVar11;
  }
  lVar8 = 0;
  while (bVar12 = lVar9 != 0, lVar9 = lVar9 + -1, bVar12) {
    iVar6 = rn2(x);
    lVar8 = lVar8 + (ulong)(iVar6 == 0);
  }
  if (lVar8 != 0) {
    bVar12 = lVar8 != 1;
    pcVar10 = "Some of your";
    if (!bVar12) {
      pcVar10 = "One of your";
    }
    if (lVar8 == lVar11) {
      pcVar10 = "Your";
    }
    pcVar7 = xname(obj);
    pline("%s %s %s!",pcVar10,pcVar7,destroy_strings[local_48 * 3 + (uint)bVar12]);
    if ((dmgtyp != 3 && osym == 8) && ((~(youmonst.data)->mflags1 & 0x1400) != 0)) {
      potionbreathe(obj);
    }
    if (obj->owornmask != 0) {
      if ((obj->owornmask & 0x60000U) == 0) {
        setnotworn(obj);
      }
      else {
        Ring_gone(obj);
      }
    }
    lVar9 = lVar8;
    if (obj == current_wand) {
      current_wand = (obj *)0x0;
    }
    while (lVar9 != 0) {
      useup(obj);
      lVar9 = lVar9 + -1;
    }
    if (uVar4 == 0) {
      pcVar10 = destroy_strings[(ulong)(uint)(local_48 * 3) + 2];
      if (lVar8 != 1) {
        pcVar10 = makeplural(pcVar10);
      }
      losehp(local_58,pcVar10,(uint)bVar12);
      exercise(0,'\0');
    }
    else {
      pline("You aren\'t hurt!");
    }
    bVar3 = '\x01';
  }
  goto LAB_00283825;
}

Assistant:

boolean destroy_item(int osym, int dmgtyp)
{
	struct obj *obj, *obj2;
	int dmg, xresist, skip;
	long i, cnt, quan;
	int dindx;
	const char *mult;
	boolean seen_destroy = FALSE;
	boolean cloak_protect;

	/* elemental immunities prevent item destruction */
	if ((dmgtyp == AD_COLD && FCold_resistance) ||
	    (dmgtyp == AD_FIRE && FFire_resistance) ||
	    (dmgtyp == AD_ELEC && FShock_resistance))
	    return FALSE;

	/* cloak of protection prevents 80% of item destruction */
	cloak_protect = (uarmc && uarmc->otyp == CLOAK_OF_PROTECTION);

	for (obj = invent; obj; obj = obj2) {
	    obj2 = obj->nobj;
	    if (obj->oclass != osym) continue; /* test only objs of type osym */
	    if (obj->oartifact) continue; /* don't destroy artifacts */
	    if (obj->in_use && obj->quan == 1) continue; /* not available */
	    if (cloak_protect && rn2(5)) continue;
	    xresist = skip = 0;
	    dmg = dindx = 0;
	    quan = 0L;

	    switch(dmgtyp) {
		case AD_COLD:
		    if (osym == POTION_CLASS && obj->otyp != POT_OIL) {
			quan = obj->quan;
			dindx = 0;
			dmg = rnd(4);
		    } else skip++;
		    break;
		case AD_FIRE:
		    xresist = (FFire_resistance && obj->oclass != POTION_CLASS);

		    if (obj->otyp == SCR_FIRE || obj->otyp == SPE_FIREBALL)
			skip++;
		    if (obj->otyp == SPE_BOOK_OF_THE_DEAD) {
			skip++;
			if (!Blind)
			    pline("%s glows a strange %s, but remains intact.",
				The(xname(obj)), hcolor("dark red"));
		    }
		    quan = obj->quan;
		    switch(osym) {
			case POTION_CLASS:
			    dindx = 1;
			    dmg = rnd(6);
			    break;
			case SCROLL_CLASS:
			    dindx = 2;
			    dmg = 1;
			    break;
			case SPBOOK_CLASS:
			    dindx = 3;
			    dmg = 1;
			    break;
			default:
			    skip++;
			    break;
		    }
		    /* Partial fire resistance only helps if full fire immunity
		     * would have helped otherwise. */
		    if (!skip && PFire_resistance && obj->oclass != POTION_CLASS)
			dmg = (dmg + 1) / 2;
		    break;
		case AD_ELEC:
		    xresist = FShock_resistance;
		    quan = obj->quan;
		    switch(osym) {
			case WAND_CLASS:
			    if (obj->otyp == WAN_LIGHTNING) { skip++; break; }
			    dindx = 4;
			    dmg = rnd(10);
			    break;
			default:
			    skip++;
			    break;
		    }
		    /* Partial shock resistance only helps if full shock resistance
		     * would have helped otherwise. */
		    if (!skip && PShock_resistance)
			dmg = (dmg + 1) / 2;
		    break;
		default:
		    skip++;
		    break;
	    }
	    if (!skip) {
		if (obj->in_use) --quan; /* one will be used up elsewhere */
		for (i = cnt = 0L; i < quan; i++)
		    if (!rn2(cloak_protect ? 15 : 3)) cnt++;

		if (!cnt) continue;
		seen_destroy = TRUE;
		if (cnt == quan)	mult = "Your";
		else	mult = (cnt == 1L) ? "One of your" : "Some of your";
		pline("%s %s %s!", mult, xname(obj),
			(cnt > 1L) ? destroy_strings[dindx*3 + 1]
				  : destroy_strings[dindx*3]);
		if (osym == POTION_CLASS && dmgtyp != AD_COLD) {
		    if (!breathless(youmonst.data) || haseyes(youmonst.data))
		    	potionbreathe(obj);
		}
		if (obj->owornmask) {
		    if (obj->owornmask & W_RING) /* ring being worn */
			Ring_gone(obj);
		    else
			setnotworn(obj);
		}
		if (obj == current_wand) current_wand = 0;	/* destroyed */
		for (i = 0; i < cnt; i++)
		    useup(obj);
		if (dmg) {
		    if (xresist)	pline("You aren't hurt!");
		    else {
			const char *how = destroy_strings[dindx * 3 + 2];
			boolean one = (cnt == 1L);

			losehp(dmg, one ? how : (const char *)makeplural(how),
			       one ? KILLED_BY_AN : KILLED_BY);
			exercise(A_STR, FALSE);
		    }
		}
	    }
	}

	return seen_destroy;
}